

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_php_generator.cc
# Opt level: O1

void __thiscall t_php_generator::generate_service_helpers(t_php_generator *this,t_service *tservice)

{
  ofstream_with_content_based_conditional_update *this_00;
  t_struct *tstruct;
  long lVar1;
  pointer pcVar2;
  int iVar3;
  ostream *poVar4;
  undefined4 extraout_var;
  long *plVar5;
  undefined8 *puVar6;
  long *plVar7;
  pointer pptVar8;
  ofstream_with_content_based_conditional_update *poVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string f_struct_definition_name;
  string name;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  long *local_108;
  long local_100;
  long local_f8;
  long lStack_f0;
  long *local_e8;
  long local_e0;
  long local_d8;
  long lStack_d0;
  t_service *local_c8;
  undefined1 *local_c0 [2];
  undefined1 local_b0 [16];
  long *local_a0;
  long local_98;
  long local_90;
  long lStack_88;
  string *local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  vector<t_function_*,_std::allocator<t_function_*>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_c8 = tservice;
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector(&local_68,&tservice->functions_);
  this_00 = &this->f_service_;
  if (this->classmap_ == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"// HELPER FUNCTIONS AND STRUCTURES",0x22);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)this_00,::endl_abi_cxx11_._M_dataplus._M_p,
                        ::endl_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  }
  if (local_68.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_68.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_70 = &(this->super_t_oop_generator).super_t_generator.service_name_;
    local_78 = &this->package_dir_;
    local_80 = (string *)
               &(this->f_service_).super_ostringstream.
                super_basic_ostream<char,_std::char_traits<char>_>.field_0x70;
    pptVar8 = local_68.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      tstruct = (*pptVar8)->arglist_;
      iVar3 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
      local_c0[0] = local_b0;
      lVar1 = *(long *)CONCAT44(extraout_var,iVar3);
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_c0,lVar1,((long *)CONCAT44(extraout_var,iVar3))[1] + lVar1);
      local_108 = &local_f8;
      pcVar2 = (this->super_t_oop_generator).super_t_generator.service_name_._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_108,pcVar2,
                 pcVar2 + (this->super_t_oop_generator).super_t_generator.service_name_.
                          _M_string_length);
      std::__cxx11::string::append((char *)&local_108);
      plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_108,(ulong)local_c0[0]);
      local_e8 = &local_d8;
      plVar7 = plVar5 + 2;
      if ((long *)*plVar5 == plVar7) {
        local_d8 = *plVar7;
        lStack_d0 = plVar5[3];
      }
      else {
        local_d8 = *plVar7;
        local_e8 = (long *)*plVar5;
      }
      local_e0 = plVar5[1];
      *plVar5 = (long)plVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[2])(tstruct,&local_e8);
      if (local_e8 != &local_d8) {
        operator_delete(local_e8);
      }
      if (local_108 != &local_f8) {
        operator_delete(local_108);
      }
      if (this->classmap_ == false) {
        std::operator+(&local_50,local_78,local_70);
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
        local_a0 = &local_90;
        plVar7 = plVar5 + 2;
        if ((long *)*plVar5 == plVar7) {
          local_90 = *plVar7;
          lStack_88 = plVar5[3];
        }
        else {
          local_90 = *plVar7;
          local_a0 = (long *)*plVar5;
        }
        local_98 = plVar5[1];
        *plVar5 = (long)plVar7;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_c0[0]);
        local_108 = &local_f8;
        plVar7 = plVar5 + 2;
        if ((long *)*plVar5 == plVar7) {
          local_f8 = *plVar7;
          lStack_f0 = plVar5[3];
        }
        else {
          local_f8 = *plVar7;
          local_108 = (long *)*plVar5;
        }
        local_100 = plVar5[1];
        *plVar5 = (long)plVar7;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_108);
        local_e8 = &local_d8;
        plVar5 = puVar6 + 2;
        if ((long *)*puVar6 == plVar5) {
          local_d8 = *plVar5;
          lStack_d0 = puVar6[3];
        }
        else {
          local_d8 = *plVar5;
          local_e8 = (long *)*puVar6;
        }
        local_e0 = puVar6[1];
        *puVar6 = plVar5;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        if (local_108 != &local_f8) {
          operator_delete(local_108);
        }
        if (local_a0 != &local_90) {
          operator_delete(local_a0);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        std::__cxx11::string::string((string *)&local_108,(char *)local_e8,(allocator *)&local_a0);
        std::__cxx11::string::_M_assign(local_80);
        template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
        clear_buf(this_00);
        (this->f_service_).super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
        field_0x90 = 0;
        if (local_108 != &local_f8) {
          operator_delete(local_108);
        }
        generate_service_header(this,local_c8,(ostream *)this_00);
        if (local_e8 != &local_d8) {
          operator_delete(local_e8);
        }
      }
      poVar9 = this_00;
      generate_php_struct_definition(this,(ostream *)this_00,tstruct,false,false);
      if (this->classmap_ == false) {
        template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
        close(this_00,(int)poVar9);
      }
      generate_php_function_helpers(this,local_c8,*pptVar8);
      (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[2])(tstruct,local_c0);
      if (local_c0[0] != local_b0) {
        operator_delete(local_c0[0]);
      }
      pptVar8 = pptVar8 + 1;
    } while (pptVar8 !=
             local_68.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  if (local_68.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void t_php_generator::generate_service_helpers(t_service* tservice) {
  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::iterator f_iter;

  ofstream_with_content_based_conditional_update& f_struct_definition = f_service_;
  if (classmap_) {
    f_struct_definition << "// HELPER FUNCTIONS AND STRUCTURES" << endl << endl;
  }

  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
    t_struct* ts = (*f_iter)->get_arglist();
    string name = ts->get_name();
    ts->set_name(service_name_ + "_" + name);

    if (!classmap_) {
      string f_struct_definition_name = package_dir_ + service_name_ + "_" + name + ".php";
      f_struct_definition.open(f_struct_definition_name.c_str());
      generate_service_header(tservice, f_struct_definition);
    }

    generate_php_struct_definition(f_struct_definition, ts);
    if (!classmap_) {
      f_struct_definition.close();
    }

    generate_php_function_helpers(tservice, *f_iter);
    ts->set_name(name);
  }
}